

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_ssl_connect(Curl_easy *data,connectdata *conn,int sockindex)

{
  _Bool _Var1;
  CURLcode result;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((((conn->bits).proxy_ssl_connected[sockindex] & 1U) == 0) ||
     (data_local._4_4_ = ssl_connect_init_proxy(conn,sockindex), data_local._4_4_ == CURLE_OK)) {
    _Var1 = ssl_prefs_check(data);
    if (_Var1) {
      conn->ssl[sockindex].field_0x10 = conn->ssl[sockindex].field_0x10 & 0xfe | 1;
      conn->ssl[sockindex].state = ssl_connection_negotiating;
      data_local._4_4_ = (*Curl_ssl->connect_blocking)(data,conn,sockindex);
      if (data_local._4_4_ == CURLE_OK) {
        Curl_pgrsTime(data,TIMER_APPCONNECT);
      }
      else {
        conn->ssl[sockindex].field_0x10 = conn->ssl[sockindex].field_0x10 & 0xfe;
      }
    }
    else {
      data_local._4_4_ = CURLE_SSL_CONNECT_ERROR;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode
Curl_ssl_connect(struct Curl_easy *data, struct connectdata *conn,
                 int sockindex)
{
  CURLcode result;

#ifndef CURL_DISABLE_PROXY
  if(conn->bits.proxy_ssl_connected[sockindex]) {
    result = ssl_connect_init_proxy(conn, sockindex);
    if(result)
      return result;
  }
#endif

  if(!ssl_prefs_check(data))
    return CURLE_SSL_CONNECT_ERROR;

  /* mark this is being ssl-enabled from here on. */
  conn->ssl[sockindex].use = TRUE;
  conn->ssl[sockindex].state = ssl_connection_negotiating;

  result = Curl_ssl->connect_blocking(data, conn, sockindex);

  if(!result)
    Curl_pgrsTime(data, TIMER_APPCONNECT); /* SSL is connected */
  else
    conn->ssl[sockindex].use = FALSE;

  return result;
}